

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiguresTests.cpp
# Opt level: O2

void __thiscall agge::tests::RoundedRectangleTests::AllowsIteration(RoundedRectangleTests *this)

{
  uint uVar1;
  allocator local_c1;
  path_commands local_c0;
  int local_bc;
  real_t y;
  real_t x;
  string local_b0;
  LocationInfo local_90;
  int cmd;
  rounded_rectangle r;
  
  rounded_rectangle::rounded_rectangle(&r,10.0,20.0,30.0,40.0,5.0,0.0);
  local_c0 = path_command_move_to;
  local_bc = rounded_rectangle::vertex(&r,&x,&y);
  std::__cxx11::string::string
            ((string *)&local_b0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/FiguresTests.cpp"
             ,&local_c1);
  ut::LocationInfo::LocationInfo(&local_90,&local_b0,0xab);
  ut::are_equal<agge::path_commands,int>(&local_c0,&local_bc,&local_90);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  uVar1 = 0xffffffff;
  do {
    cmd = rounded_rectangle::vertex(&r,&x,&y);
    uVar1 = uVar1 + 1;
  } while (cmd == 2);
  std::__cxx11::string::string
            ((string *)&local_b0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/FiguresTests.cpp"
             ,(allocator *)&local_c0);
  ut::LocationInfo::LocationInfo(&local_90,&local_b0,0xb0);
  ut::is_true(10 < uVar1,&local_90);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  local_c0 = 0x30;
  std::__cxx11::string::string
            ((string *)&local_b0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/FiguresTests.cpp"
             ,(allocator *)&local_bc);
  ut::LocationInfo::LocationInfo(&local_90,&local_b0,0xb1);
  ut::are_equal<int,int>((int *)&local_c0,&cmd,&local_90);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  local_c0 = path_command_stop;
  local_bc = rounded_rectangle::vertex(&r,&x,&y);
  std::__cxx11::string::string
            ((string *)&local_b0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/FiguresTests.cpp"
             ,&local_c1);
  ut::LocationInfo::LocationInfo(&local_90,&local_b0,0xb2);
  ut::are_equal<agge::path_commands,int>(&local_c0,&local_bc,&local_90);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  local_c0 = path_command_stop;
  local_bc = rounded_rectangle::vertex(&r,&x,&y);
  std::__cxx11::string::string
            ((string *)&local_b0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/FiguresTests.cpp"
             ,&local_c1);
  ut::LocationInfo::LocationInfo(&local_90,&local_b0,0xb3);
  ut::are_equal<agge::path_commands,int>(&local_c0,&local_bc,&local_90);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

test( AllowsIteration )
			{
				// INIT
				real_t x, y;

				// INIT / ACT
				rounded_rectangle r(10.0f, 20.0f, 30.0f, 40.0f, 5.0f);

				// ACT / ASSERT
				int n = 0;
				int cmd;

				assert_equal(path_command_move_to, r.vertex(&x, &y));

				for (; path_command_line_to == (cmd = r.vertex(&x, &y)); ++n)
				{	}
				
				assert_is_true(n >= 11);
				assert_equal(path_command_end_poly | path_flag_close, cmd);
				assert_equal(path_command_stop, r.vertex(&x, &y));
				assert_equal(path_command_stop, r.vertex(&x, &y));
			}